

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O3

void __thiscall TRM::Bitmap::ReadFromFile(Bitmap *this,char *filename)

{
  ulong uVar1;
  long lVar2;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  Color color;
  int n;
  int y;
  int x;
  array<unsigned_char,_4UL> local_7c;
  ulong local_78;
  int local_6c;
  ulong local_68;
  Bitmap *local_60;
  ulong local_58;
  long local_50;
  vector<TRM::Color,_std::allocator<TRM::Color>_> *local_48;
  stbi_uc *local_40;
  uint local_38;
  int local_34;
  
  local_40 = stbi_load(filename,&local_34,(int *)&local_38,&local_6c,0);
  local_48 = &this->fPixels;
  uVar1 = (ulong)local_34;
  local_68 = (ulong)local_38;
  local_60 = this;
  std::vector<TRM::Color,_std::allocator<TRM::Color>_>::resize
            (local_48,(long)(int)(local_38 * local_34));
  local_78 = uVar1;
  if (0 < (long)uVar1) {
    lVar2 = 0;
    local_58 = 0;
    do {
      uVar4 = local_58 & 0xffffffff;
      uVar3 = local_68;
      local_50 = lVar2;
      if (0 < (int)local_68) {
        do {
          Color::Color((Color *)&local_7c);
          __n = (size_t)local_6c;
          memcpy(&local_7c,local_40 + local_6c * (int)uVar4,__n);
          if ((long)__n < 4) {
            local_7c._M_elems[3] = 0xff;
          }
          *(_Type *)((((local_48->super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>).
                       _M_impl.super__Vector_impl_data._M_start)->fRGBA)._M_elems + lVar2) =
               local_7c._M_elems;
          lVar2 = lVar2 + uVar1 * 4;
          uVar4 = (ulong)(uint)((int)uVar4 + (int)local_78);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      local_58 = local_58 + 1;
      lVar2 = local_50 + 4;
    } while (local_58 != local_78);
  }
  local_60->fWidth = (uint32_t)local_78;
  local_60->fHeight = (uint32_t)local_68;
  return;
}

Assistant:

void Bitmap::ReadFromFile(const char *filename) {
  int x, y, n;
  unsigned char *data = stbi_load(filename, &x, &y, &n, 0);
  fPixels.resize(x * y);
  for (int i = 0; i < x; i++) {
    for (int j = 0; j < y; j++) {
      Color color;
      std::memcpy(color.rgba().data(), data + (j * x + i) * n, n);
      if (n < 4) {
        color.rgba()[3] = 255;
      }
      fPixels[j * x + i] = color;
    }
  }

  fWidth = x;
  fHeight = y;
}